

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_intarith(ASMState *as,IRIns *ir,x86Arith xa)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  IRIns *pIVar5;
  MCode *pMVar6;
  uint uVar7;
  Reg dest;
  int i;
  int iVar8;
  Reg RVar9;
  byte *pbVar10;
  ulong uVar11;
  uint uVar12;
  x86Op xVar13;
  byte bVar14;
  uint uVar15;
  bool bVar16;
  IRRef local_3c;
  
  uVar1 = (ir->field_0).op1;
  local_3c = (IRRef)uVar1;
  uVar2 = (ir->field_0).op2;
  pbVar10 = as->mcp;
  if (as->flagmcp == pbVar10) {
    pbVar10 = pbVar10 + (ulong)(*pbVar10 < 0x84) + 2;
    bVar14 = pbVar10[*pbVar10 == 0xf] & 0xf;
    if (bVar14 < 0xe) {
      if (0xb < bVar14) {
        pbVar10[*pbVar10 == 0xf] = pbVar10[*pbVar10 == 0xf] - 4;
      }
      as->flagmcp = (MCode *)0x0;
      as->mcp = pbVar10;
    }
  }
  bVar14 = *(byte *)((long)as->ir + (ulong)uVar2 * 8 + 6);
  if ((char)bVar14 < '\0') {
    uVar12 = 0xbfef;
  }
  else {
    uVar12 = ~(1 << (bVar14 & 0x1f)) & 0xbfef;
    as->weakset = as->weakset & (-2 << (bVar14 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar14 & 0x1f));
  }
  dest = ra_dest(as,ir,uVar12);
  i = 0;
  RVar9 = dest;
  if ((uVar1 != uVar2) && (i = 0, RVar9 = (uint)bVar14, (char)bVar14 < '\0')) {
    uVar15 = (uint)uVar2;
    if ((short)uVar2 < 0) {
      bVar16 = true;
      i = 0;
    }
    else {
      pIVar5 = as->ir;
      uVar11 = (ulong)uVar15;
      if ((*(char *)((long)pIVar5 + uVar11 * 8 + 5) == '\x1b') ||
         ((0x605fd9U >> (*(uint *)((long)pIVar5 + uVar11 * 8 + 4) & 0x1f) & 1) == 0)) {
        bVar16 = false;
        i = pIVar5[uVar11].i;
      }
      else {
        i = pIVar5[uVar11 + 1].i;
        bVar16 = (IRIns)(long)i != pIVar5[uVar11 + 1];
        if (bVar16) {
          i = 0;
        }
      }
    }
    RVar9 = (uint)bVar14;
    if (bVar16) {
      iVar8 = asm_swapops(as,ir);
      uVar7 = uVar15;
      if (iVar8 == 0) {
        uVar7 = local_3c;
        local_3c = uVar15;
      }
      uVar15._0_2_ = *(IROpT *)((long)ir + 4);
      uVar15._2_2_ = *(IRRef1 *)((long)ir + 6);
      RVar9 = asm_fuseloadm(as,local_3c,uVar12 & ~(1 << (dest & 0x1f)),
                            (uint)((0x605fd9U >> (uVar15 & 0x1f) & 1) != 0));
      local_3c = uVar7;
    }
  }
  if ((char)(ir->field_1).t.irt < '\0') {
    asm_guardcc(as,0);
  }
  if (xa == XOg_X_IMUL) {
    uVar3._0_2_ = *(IROpT *)((long)ir + 4);
    uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar15 = (uint)((0x605fd9U >> (uVar3 & 0x1f) & 1) != 0);
    if ((char)RVar9 < '\0') {
      RVar9 = asm_fuseloadm(as,local_3c,0xbfef,uVar15);
      if ((char)(MCode)i == i) {
        pMVar6 = as->mcp;
        as->mcp = pMVar6 + -1;
        pMVar6[-1] = (MCode)i;
        xVar13 = XO_IMULi8;
      }
      else {
        pMVar6 = as->mcp;
        *(int *)(pMVar6 + -4) = i;
        as->mcp = pMVar6 + -4;
        xVar13 = XO_IMULi;
      }
      uVar4._0_2_ = *(IROpT *)((long)ir + 4);
      uVar4._2_2_ = *(IRRef1 *)((long)ir + 6);
      emit_mrm(as,xVar13,-(uint)((0x605fd9U >> (uVar4 & 0x1f) & 1) != 0) & 0x80200 | dest,RVar9);
      return;
    }
    uVar12 = 0x80200;
    if (uVar15 == 0) {
      uVar12 = 0;
    }
    xVar13 = XO_IMUL;
  }
  else {
    if ((char)RVar9 < '\0') {
      uVar12._0_2_ = *(IROpT *)((long)ir + 4);
      uVar12._2_2_ = *(IRRef1 *)((long)ir + 6);
      emit_gri(as,xa + 0x838100,-(uint)((0x605fd9U >> (uVar12 & 0x1f) & 1) != 0) & 0x80200 | dest,i)
      ;
      goto LAB_0013dbe9;
    }
    xVar13 = xa << 0x1b | 0x30000fe;
    uVar7._0_2_ = *(IROpT *)((long)ir + 4);
    uVar7._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar12 = -(uint)((0x605fd9U >> (uVar7 & 0x1f) & 1) != 0) & 0x80200;
  }
  emit_mrm(as,xVar13,uVar12 | dest,RVar9);
LAB_0013dbe9:
  ra_left(as,dest,local_3c);
  return;
}

Assistant:

static void asm_intarith(ASMState *as, IRIns *ir, x86Arith xa)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_GPR;
  Reg dest, right;
  int32_t k = 0;
  if (as->flagmcp == as->mcp) {  /* Drop test r,r instruction. */
    MCode *p = as->mcp + ((LJ_64 && *as->mcp < XI_TESTb) ? 3 : 2);
    MCode *q = p[0] == 0x0f ? p+1 : p;
    if ((*q & 15) < 14) {
      if ((*q & 15) >= 12) *q -= 4;  /* L <->S, NL <-> NS */
      as->flagmcp = NULL;
      as->mcp = p;
    }  /* else: cannot transform LE/NLE to cc without use of OF. */
  }
  right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right) && !asm_isk32(as, rref, &k)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseloadm(as, rref, rset_clear(allow, dest), irt_is64(ir->t));
  }
  if (irt_isguard(ir->t))  /* For IR_ADDOV etc. */
    asm_guardcc(as, CC_O);
  if (xa != XOg_X_IMUL) {
    if (ra_hasreg(right))
      emit_mrm(as, XO_ARITH(xa), REX_64IR(ir, dest), right);
    else
      emit_gri(as, XG_ARITHi(xa), REX_64IR(ir, dest), k);
  } else if (ra_hasreg(right)) {  /* IMUL r, mrm. */
    emit_mrm(as, XO_IMUL, REX_64IR(ir, dest), right);
  } else {  /* IMUL r, r, k. */
    /* NYI: use lea/shl/add/sub (FOLD only does 2^k) depending on CPU. */
    Reg left = asm_fuseloadm(as, lref, RSET_GPR, irt_is64(ir->t));
    x86Op xo;
    if (checki8(k)) { emit_i8(as, k); xo = XO_IMULi8;
    } else { emit_i32(as, k); xo = XO_IMULi; }
    emit_mrm(as, xo, REX_64IR(ir, dest), left);
    return;
  }
  ra_left(as, dest, lref);
}